

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<unsigned_int>::setCapacity(Vector<unsigned_int> *this,size_t newSize)

{
  uint *puVar1;
  uint *puVar2;
  RemoveConst<unsigned_int> *pRVar3;
  ulong __n;
  ArrayBuilder<unsigned_int> local_38;
  
  puVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)puVar1 >> 2)) {
    (this->builder).pos = puVar1 + newSize;
  }
  local_38.pos = (RemoveConst<unsigned_int> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (4,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.pos + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  puVar1 = (this->builder).ptr;
  puVar2 = (this->builder).pos;
  local_38.ptr = local_38.pos;
  if (puVar1 != puVar2) {
    __n = (long)puVar2 - (long)puVar1 & 0xfffffffffffffffc;
    memcpy(local_38.pos,puVar1,__n);
    local_38.pos = (RemoveConst<unsigned_int> *)((long)local_38.pos + __n);
  }
  ArrayBuilder<unsigned_int>::operator=(&this->builder,&local_38);
  puVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  puVar1 = local_38.ptr;
  if (local_38.ptr != (uint *)0x0) {
    local_38.ptr = (uint *)0x0;
    local_38.pos = (RemoveConst<unsigned_int> *)0x0;
    local_38.endPtr = (uint *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,puVar1,4,(long)pRVar3 - (long)puVar1 >> 2,
               (long)puVar2 - (long)puVar1 >> 2,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }